

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

void __thiscall Js::TypedArrayBase::ClearLengthAndBufferOnDetach(TypedArrayBase *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type puVar4;
  TypedArrayBase *this_local;
  
  bVar2 = IsDetachedBuffer(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x3ea,"(IsDetachedBuffer())",
                                "Array buffer should be detached if we\'re calling this method");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr();
    *puVar3 = 0;
  }
  (this->super_ArrayBufferParent).super_ArrayObject.length = 0;
  puVar4 = (Type)TaggedInt::ToVarUnchecked(0);
  this->buffer = puVar4;
  return;
}

Assistant:

void TypedArrayBase::ClearLengthAndBufferOnDetach()
    {
        AssertMsg(IsDetachedBuffer(), "Array buffer should be detached if we're calling this method");

        this->length = 0;
#if INT32VAR
        this->buffer = (BYTE*)TaggedInt::ToVarUnchecked(0);
#else
        this->buffer = nullptr;
#endif
    }